

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest01SignatureVerification_::
Section1InvalidCASignatureTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section1InvalidCASignatureTest2
          (Section1InvalidCASignatureTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest01SignatureVerification,
                     Section1InvalidCASignatureTest2) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "BadSignedCACert",
                               "InvalidCASignatureTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "BadSignedCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.1.2";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}